

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* units::find_unit_pair_abi_cxx11_(unit un)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> __x;
  _Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> __y;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  const_iterator fnd;
  iterator fndud;
  pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa8;
  pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffb0;
  atomic<bool> *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  in_stack_ffffffffffffffe0;
  _Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_18 [3];
  
  bVar1 = std::atomic<bool>::load
                    (in_stack_ffffffffffffffb8,
                     (memory_order)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  if ((bVar1) &&
     (bVar1 = std::
              unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::empty((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)0x736951), !bVar1)) {
    local_18[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_ffffffffffffffa8,(key_type *)0x736966);
    in_stack_ffffffffffffffe0._M_cur =
         (__node_type *)
         std::
         unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_ffffffffffffffa8);
    bVar1 = std::__detail::operator==
                      (local_18,(_Node_iterator_base<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                 *)&stack0xffffffffffffffe0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::__detail::
      _Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)0x73699d);
      std::__detail::
      _Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)0x7369ac);
      std::
      pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (in_stack_ffffffffffffffb0,&in_stack_ffffffffffffffa8->first,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7369c2);
      return in_RDI;
    }
  }
  __x._M_cur = (__node_type *)
               std::
               unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
               ::find((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
                       *)in_stack_ffffffffffffffa8,(key_type *)0x7369dc);
  __y._M_cur = (__node_type *)
               std::
               unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
               ::end((unordered_map<units::unit,_const_char_*,_std::hash<units::unit>,_std::equal_to<units::unit>,_std::allocator<std::pair<const_units::unit,_const_char_*>_>_>
                      *)in_stack_ffffffffffffffa8);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> *)
                     &stack0xffffffffffffffd8,
                     (_Node_iterator_base<std::pair<const_units::unit,_const_char_*>,_true> *)
                     &stack0xffffffffffffffd0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    std::__detail::_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>::
    operator->((_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true> *)
               0x736a13);
    std::__detail::_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true>::
    operator->((_Node_const_iterator<std::pair<const_units::unit,_const_char_*>,_false,_true> *)
               0x736a22);
    std::
    pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<const_char_*const_&,_true>
              ((pair<units::unit,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffffe0._M_cur,(unit *)__x._M_cur,(char **)__y._M_cur);
  }
  return in_RDI;
}

Assistant:

static std::pair<unit, std::string> find_unit_pair(unit un)
{  // cppcheck suppression active
    if (allowUserDefinedUnits.load(std::memory_order_acquire)) {
        if (!user_defined_unit_names.empty()) {
            auto fndud = user_defined_unit_names.find(un);
            if (fndud != user_defined_unit_names.end()) {
                return {fndud->first, fndud->second};
            }
        }
    }
    auto fnd = base_unit_names.find(un);
    if (fnd != base_unit_names.end()) {
        return {fnd->first, fnd->second};
    }
    return nullret;
}